

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_variable_reference.cpp
# Opt level: O0

void display_record(dota_record *r)

{
  ostream *poVar1;
  dota_record *r_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Player [");
  poVar1 = std::operator<<(poVar1,(string *)r);
  poVar1 = std::operator<<(poVar1,"] win [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,r->win);
  poVar1 = std::operator<<(poVar1,"] games in [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,r->played);
  poVar1 = std::operator<<(poVar1,"] plays at a rate of [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,r->rate);
  std::operator<<(poVar1,"%].\n");
  return;
}

Assistant:

void display_record (const dota_record & r) {
    std::cout << "Player [" << r.name << "] win [" << r.win << "] games in [" << r.played << "] plays at a rate of [" << r.rate << "%].\n";
}